

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall Fossilize::DumbDirectoryDatabase::prepare(DumbDirectoryDatabase *this)

{
  bool bVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  bool bVar4;
  uint tag;
  uint64_t value;
  ResourceTag local_44;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_40;
  Hash local_38;
  
  bVar4 = true;
  if (this->mode != OverWrite) {
    __dirp = opendir((this->base_directory)._M_dataplus._M_p);
    if (__dirp == (DIR *)0x0) {
LAB_001714fd:
      bVar4 = false;
    }
    else {
      local_40 = this->seen_blobs;
      while( true ) {
        pdVar3 = readdir(__dirp);
        if (pdVar3 == (dirent *)0x0) break;
        if ((shutdown_requested & 1) != 0) goto LAB_001714fd;
        if (pdVar3->d_type == '\b') {
          iVar2 = __isoc99_sscanf(pdVar3->d_name,"%x.%lx.json",&local_44,&local_38);
          if ((iVar2 == 2) && (local_44 < RESOURCE_COUNT)) {
            bVar1 = DatabaseInterface::test_resource_filter
                              (&this->super_DatabaseInterface,local_44,local_38);
            if (bVar1) {
              std::__detail::
              _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)(local_40 + local_44),&local_38);
            }
          }
        }
      }
      closedir(__dirp);
    }
  }
  return bVar4;
}

Assistant:

bool prepare() override
	{
		if (mode == DatabaseMode::OverWrite)
			return true;

		DIR *dp = opendir(base_directory.c_str());
		if (!dp)
			return false;

		while (auto *pEntry = readdir(dp))
		{
			if (shutdown_requested.load(std::memory_order_relaxed))
				return false;

			if (pEntry->d_type != DT_REG)
				continue;

			unsigned tag;
			uint64_t value;
			if (sscanf(pEntry->d_name, "%x.%" SCNx64 ".json", &tag, &value) != 2)
				continue;

			if (tag >= RESOURCE_COUNT)
				continue;

			if (test_resource_filter(static_cast<ResourceTag>(tag), value))
				seen_blobs[tag].insert(value);
		}

		closedir(dp);
		return true;
	}